

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

Transliterator * icu_63::Transliterator::createBasicInstance(UnicodeString *id,UnicodeString *canon)

{
  TransliteratorAlias *pTVar1;
  UBool UVar2;
  Transliterator *this;
  TransliteratorParser *p;
  UParseError *pe_00;
  UnicodeString *id_00;
  UErrorCode ec;
  TransliteratorAlias *alias;
  UParseError pe;
  TransliteratorParser parser;
  UErrorCode local_284;
  TransliteratorAlias *local_280;
  UnicodeString *local_278;
  UParseError local_270;
  TransliteratorParser local_228;
  
  local_284 = U_ZERO_ERROR;
  local_280 = (TransliteratorAlias *)0x0;
  p = (TransliteratorParser *)canon;
  umtx_lock_63(&registryMutex);
  if ((registry == (TransliteratorRegistry *)0x0) &&
     (UVar2 = initializeRegistry(&local_284), UVar2 == '\0')) {
    this = (Transliterator *)0x0;
  }
  else {
    p = (TransliteratorParser *)id;
    this = TransliteratorRegistry::get(registry,id,&local_280,&local_284);
  }
  umtx_unlock_63(&registryMutex);
  if (local_284 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_278 = canon;
    do {
      id_00 = local_278;
      if (local_280 == (TransliteratorAlias *)0x0) {
LAB_0027116a:
        if (id_00 == (UnicodeString *)0x0) {
          return this;
        }
        if (this == (Transliterator *)0x0) {
          return (Transliterator *)0x0;
        }
        setID(this,id_00);
        return this;
      }
      UVar2 = TransliteratorAlias::isRuleBased(local_280);
      if (UVar2 == '\0') {
        pe_00 = &local_270;
        this = TransliteratorAlias::create(local_280,pe_00,&local_284);
        id_00 = local_278;
        pTVar1 = local_280;
        if (local_280 != (TransliteratorAlias *)0x0) {
          TransliteratorAlias::~TransliteratorAlias(local_280);
        }
        UMemory::operator_delete((UMemory *)pTVar1,pe_00);
        local_280 = (TransliteratorAlias *)0x0;
        goto LAB_0027116a;
      }
      TransliteratorParser::TransliteratorParser(&local_228,&local_284);
      p = &local_228;
      TransliteratorAlias::parse(local_280,&local_228,&local_270,&local_284);
      pTVar1 = local_280;
      if (local_280 != (TransliteratorAlias *)0x0) {
        TransliteratorAlias::~TransliteratorAlias(local_280);
      }
      UMemory::operator_delete((UMemory *)pTVar1,p);
      local_280 = (TransliteratorAlias *)0x0;
      umtx_lock_63(&registryMutex);
      if ((registry != (TransliteratorRegistry *)0x0) ||
         (UVar2 = initializeRegistry(&local_284), UVar2 != '\0')) {
        p = (TransliteratorParser *)id;
        this = TransliteratorRegistry::reget(registry,id,&local_228,&local_280,&local_284);
      }
      umtx_unlock_63(&registryMutex);
      TransliteratorParser::~TransliteratorParser(&local_228);
    } while (local_284 < U_ILLEGAL_ARGUMENT_ERROR);
  }
  if (this != (Transliterator *)0x0) {
    (*(this->super_UObject)._vptr_UObject[1])(this);
  }
  pTVar1 = local_280;
  if (local_280 != (TransliteratorAlias *)0x0) {
    TransliteratorAlias::~TransliteratorAlias(local_280);
  }
  UMemory::operator_delete((UMemory *)pTVar1,p);
  return (Transliterator *)0x0;
}

Assistant:

Transliterator* Transliterator::createBasicInstance(const UnicodeString& id,
                                                    const UnicodeString* canon) {
    UParseError pe;
    UErrorCode ec = U_ZERO_ERROR;
    TransliteratorAlias* alias = 0;
    Transliterator* t = 0;

    umtx_lock(&registryMutex);
    if (HAVE_REGISTRY(ec)) {
        t = registry->get(id, alias, ec);
    }
    umtx_unlock(&registryMutex);

    if (U_FAILURE(ec)) {
        delete t;
        delete alias;
        return 0;
    }

    // We may have not gotten a transliterator:  Because we can't
    // instantiate a transliterator from inside TransliteratorRegistry::
    // get() (that would deadlock), we sometimes pass back an alias.  This
    // contains the data we need to finish the instantiation outside the
    // registry mutex.  The alias may, in turn, generate another alias, so
    // we handle aliases in a loop.  The max times through the loop is two.
    // [alan]
    while (alias != 0) {
        U_ASSERT(t==0);
        // Rule-based aliases are handled with TransliteratorAlias::
        // parse(), followed by TransliteratorRegistry::reget().
        // Other aliases are handled with TransliteratorAlias::create().
        if (alias->isRuleBased()) {
            // Step 1. parse
            TransliteratorParser parser(ec);
            alias->parse(parser, pe, ec);
            delete alias;
            alias = 0;

            // Step 2. reget
            umtx_lock(&registryMutex);
            if (HAVE_REGISTRY(ec)) {
                t = registry->reget(id, parser, alias, ec);
            }
            umtx_unlock(&registryMutex);

            // Step 3. Loop back around!
        } else {
            t = alias->create(pe, ec);
            delete alias;
            alias = 0;
            break;
        }
        if (U_FAILURE(ec)) {
            delete t;
            delete alias;
            t = NULL;
            break;
        }
    }

    if (t != NULL && canon != NULL) {
        t->setID(*canon);
    }

    return t;
}